

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDiv<(moira::Instr)58,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ushort in_SI;
  Moira *in_RDI;
  Moira *unaff_retaddr;
  u32 dividend;
  u32 result;
  u32 divisor;
  u32 ea;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  Moira *pMVar3;
  
  pMVar3 = in_RDI;
  bVar1 = readOp<(moira::Mode)5,(moira::Size)2,128ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),in_stack_ffffffffffffffe4,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (u32 *)in_RDI);
  if (bVar1) {
    uVar2 = readD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffcc);
    if (in_stack_ffffffffffffffe4 == 0) {
      bVar1 = NBIT<(moira::Size)4>((ulong)uVar2);
      (in_RDI->reg).sr.n = bVar1;
      (in_RDI->reg).sr.z = (uVar2 & 0xffff0000) == 0;
      (in_RDI->reg).sr.v = false;
      (in_RDI->reg).sr.c = false;
      (*in_RDI->_vptr_Moira[0x19])(in_RDI,8);
      execTrapException(in_RDI,in_stack_ffffffffffffffcc);
    }
    else {
      div<(moira::Instr)58>(unaff_retaddr,(u32)((ulong)pMVar3 >> 0x20),(u32)pMVar3);
      writeD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      prefetch<4ul>(in_RDI);
    }
  }
  return;
}

Assistant:

void
Moira::execDiv(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execDivMusashi<I, M, S>(opcode);
        return;
    }

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, divisor, result;
    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, divisor)) return;
    u32 dividend = readD(dst);
    
    // Check for division by zero
    if (divisor == 0) {

        if (I == DIVU) {
            reg.sr.n = NBIT<Long>(dividend);
            reg.sr.z = (dividend & 0xFFFF0000) == 0;
            reg.sr.v = 0;
            reg.sr.c = 0;
        } else {
            reg.sr.n = 0;
            reg.sr.z = 1;
            reg.sr.v = 0;
            reg.sr.c = 0;
        }

        sync(8);
        execTrapException(5);
        return;
    }

    result = div<I>(dividend, divisor);

    writeD(dst, result);
    prefetch<POLLIPL>();
}